

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  anon_union_280_3_6d7b35ba_for_proto *pp;
  int iVar1;
  connectdata *pcVar2;
  FILEPROTO *pFVar3;
  CURLcode CVar4;
  connectdata *conn;
  char *pcVar5;
  long lVar6;
  undefined8 *puVar7;
  int iVar8;
  connectdata *conn_1;
  bool bVar9;
  
  pcVar2 = data->conn;
  lVar6 = 0x6c0;
  if ((byte)(instate - 0xd) < 3) {
    lVar6 = *(long *)(&DAT_00173008 + (ulong)(byte)(instate - 0xd) * 8);
  }
  pFVar3 = (data->req).p.file;
  pp = &pcVar2->proto;
  puVar7 = *(undefined8 **)((long)&data->magic + lVar6);
  if (init) {
    (pcVar2->proto).ftpc.count1 = 0;
LAB_0013255f:
    if (puVar7 != (undefined8 *)0x0) {
LAB_00132593:
      pcVar5 = (char *)*puVar7;
      bVar9 = *pcVar5 == '*';
      *(uint *)((long)&pcVar2->proto + 0x104) = (uint)bVar9;
      CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",pcVar5 + bVar9);
      if (CVar4 == CURLE_OK) {
        (data->conn->proto).ftpc.state = instate;
        CVar4 = CURLE_OK;
      }
      return CVar4;
    }
  }
  else {
    iVar1 = (pcVar2->proto).ftpc.count1;
    (pcVar2->proto).ftpc.count1 = iVar1 + 1;
    if (puVar7 != (undefined8 *)0x0) {
      if (iVar1 < 0) goto LAB_00132593;
      iVar8 = 0;
      do {
        puVar7 = (undefined8 *)puVar7[1];
        if (iVar1 <= iVar8) break;
        iVar8 = iVar8 + 1;
      } while (puVar7 != (undefined8 *)0x0);
      goto LAB_0013255f;
    }
  }
  if (instate == '\r') {
    if (pFVar3->fd != 0) {
      (pcVar2->proto).ftpc.state = '\0';
      return CURLE_OK;
    }
    lVar6 = (pcVar2->proto).ftpc.known_filesize;
    if (lVar6 == -1) {
      if ((((data->set).field_0x8be & 4) == 0) && (((data->state).field_0x74d & 0x40) == 0)) {
        CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(pcVar2->proto).ftpc.file);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        (data->conn->proto).ftpc.state = '\x18';
        return CURLE_OK;
      }
      CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar2->proto).ftpc.file);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      (data->conn->proto).ftpc.state = ' ';
      return CURLE_OK;
    }
    Curl_pgrsSetDownloadSize(data,lVar6);
    CVar4 = ftp_state_retr(data,(pcVar2->proto).ftpc.known_filesize);
    return CVar4;
  }
  if (instate == '\x0e') {
    CVar4 = ftp_state_ul_setup(data,false);
    return CVar4;
  }
  if (instate == '\x0f') {
    return CURLE_OK;
  }
  if ((*(byte *)((long)&pcVar2->proto + 0x112) & 8) == 0) {
    (pcVar2->proto).ftpc.count2 = 0;
    if (((((uint)pcVar2->bits & 0x80) == 0) ||
        (pcVar5 = (pcVar2->proto).ftpc.entrypath, pcVar5 == (char *)0x0)) ||
       (((pcVar2->proto).ftpc.dirdepth != 0 && (**(pcVar2->proto).ftpc.dirs == '/')))) {
      if ((pcVar2->proto).ftpc.dirdepth == 0) goto LAB_0013269d;
      (pcVar2->proto).ftpc.cwdcount = 1;
      pcVar5 = *(pcVar2->proto).ftpc.dirs;
    }
    else {
      (pcVar2->proto).ftpc.cwdcount = 0;
    }
    CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"CWD %s",pcVar5);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    (data->conn->proto).ftpc.state = '\x10';
    return CURLE_OK;
  }
LAB_0013269d:
  CVar4 = ftp_state_mdtm(data);
  return CVar4;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      ftp_state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        ftp_state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files.  It
               prevents the state machine from requesting the file size from
               the server.  With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size.  Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers don't report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}